

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

void lex_expect(Lexer *lxr,Tk expected)

{
  uint uVar1;
  Err *err;
  TkInfo *pTVar2;
  char *pcVar3;
  char local_14 [4];
  
  uVar1 = (lxr->tk).type;
  if (uVar1 != expected) {
    if (expected < 0x100) {
      pcVar3 = local_14;
    }
    else {
      pcVar3 = TK_NAMES[(uint)expected];
    }
    if ((int)uVar1 < 0x100) {
      pTVar2 = &lxr->tk;
    }
    else {
      pTVar2 = (TkInfo *)TK_NAMES[uVar1];
    }
    err = err_new("expected %s, found %s",pcVar3,pTVar2);
    err_file(err,lxr->path);
    err->line = (lxr->tk).line;
    err_trigger(lxr->vm,err);
  }
  return;
}

Assistant:

void lex_expect(Lexer *lxr, Tk expected) {
	if (lxr->tk.type != expected) {
		Err *err = err_new("expected %s, found %s", tk_to_string(&expected),
			tk_to_string(&lxr->tk.type));
		err_file(err, lxr->path);
		err->line = lxr->tk.line;
		err_trigger(lxr->vm, err);
	}
}